

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

numeric * __thiscall
cs::numeric::operator/(numeric *__return_storage_ptr__,numeric *this,numeric *rhs)

{
  numeric *pnVar1;
  
  pnVar1 = (numeric *)
           (*(code *)(&DAT_001f9af4 +
                     *(int *)(&DAT_001f9af4 + (ulong)(byte)(this->type * '\x02' | rhs->type) * 4)))
                     ();
  return pnVar1;
}

Assistant:

numeric operator/(const numeric &rhs) const noexcept
		{
			switch (get_composite_type(type, rhs.type)) {
			default:
			case 0b00:
				return data._num / rhs.data._num;
			case 0b01:
				return data._num / rhs.data._int;
			case 0b10:
				return data._int / rhs.data._num;
			case 0b11:
				if (data._int % rhs.data._int != 0)
					return static_cast<numeric_float>(data._int) / rhs.data._int;
				else
					return data._int / rhs.data._int;
			}
		}